

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode Curl_connect(SessionHandle *data,connectdata **in_connect,_Bool *asyncp,
                     _Bool *protocol_done)

{
  char cVar1;
  curl_proxytype cVar2;
  uint uVar3;
  bool bVar4;
  connectdata *pcVar5;
  int iVar6;
  uchar *ch;
  connectdata *pcVar7;
  char *pcVar8;
  curl_llist *pcVar9;
  size_t sVar10;
  size_t sVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  ulong uVar15;
  char *pcVar16;
  CURLcode CVar17;
  Curl_handler *pCVar18;
  Curl_handler **ppCVar19;
  bool bVar20;
  _Bool _Var21;
  timeval tVar22;
  connectdata *conn_temp;
  char passwd [256];
  char user [256];
  char protobuf [16];
  connectdata *local_448;
  ulong local_440;
  char local_438 [256];
  char local_338 [256];
  _Bool local_238 [255];
  undefined1 local_139;
  char *local_138 [31];
  undefined1 local_39;
  
  *asyncp = false;
  local_448 = (connectdata *)0x0;
  *asyncp = false;
  if ((data->change).url == (char *)0x0) {
    CVar17 = CURLE_URL_MALFORMAT;
    goto LAB_0011df9f;
  }
  pcVar7 = (connectdata *)(*Curl_ccalloc)(1,0x590);
  if (pcVar7 == (connectdata *)0x0) {
LAB_0011d71d:
    pcVar7 = (connectdata *)0x0;
  }
  else {
    pcVar7->handler = &Curl_handler_dummy;
    pcVar7->sock[0] = -1;
    pcVar7->sock[1] = -1;
    pcVar7->connectindex = -1;
    pcVar7->port = -1;
    (pcVar7->bits).close = true;
    tVar22 = curlx_tvnow();
    pcVar7->created = tVar22;
    pcVar7->data = data;
    cVar2 = (data->set).proxytype;
    pcVar7->proxytype = cVar2;
    pcVar8 = (data->set).str[0x10];
    if (pcVar8 == (char *)0x0) {
      (pcVar7->bits).proxy = false;
LAB_0011d55c:
      _Var21 = false;
    }
    else {
      bVar20 = *pcVar8 == '\0';
      (pcVar7->bits).proxy = !bVar20;
      if (bVar20) goto LAB_0011d55c;
      if (cVar2 == CURLPROXY_HTTP) {
        _Var21 = true;
      }
      else {
        _Var21 = cVar2 == CURLPROXY_HTTP_1_0;
      }
    }
    (pcVar7->bits).httpproxy = _Var21;
    (pcVar7->bits).proxy_user_passwd = (data->set).str[0x1e] != (char *)0x0;
    (pcVar7->bits).tunnel_proxy = (data->set).tunnel_thru_httpproxy;
    (pcVar7->bits).user_passwd = (data->set).str[0x1c] != (char *)0x0;
    (pcVar7->bits).ftp_use_epsv = (data->set).ftp_use_epsv;
    (pcVar7->bits).ftp_use_eprt = (data->set).ftp_use_eprt;
    pcVar7->verifypeer = (data->set).ssl.verifypeer;
    pcVar7->verifyhost = (data->set).ssl.verifyhost;
    pcVar7->ip_version = (data->set).ipver;
    if (((data->multi != (Curl_multi *)0x0) &&
        (_Var21 = Curl_multi_canPipeline(data->multi), _Var21)) &&
       (pcVar7->master_buffer == (char *)0x0)) {
      pcVar8 = (char *)(*Curl_ccalloc)(0x4000,1);
      pcVar7->master_buffer = pcVar8;
      if (pcVar8 != (char *)0x0) goto LAB_0011d616;
LAB_0011d686:
      Curl_llist_destroy(pcVar7->send_pipe,(void *)0x0);
      Curl_llist_destroy(pcVar7->recv_pipe,(void *)0x0);
      Curl_llist_destroy(pcVar7->pend_pipe,(void *)0x0);
      Curl_llist_destroy(pcVar7->done_pipe,(void *)0x0);
      pcVar7->pend_pipe = (curl_llist *)0x0;
      pcVar7->done_pipe = (curl_llist *)0x0;
      pcVar7->send_pipe = (curl_llist *)0x0;
      pcVar7->recv_pipe = (curl_llist *)0x0;
      if (pcVar7->master_buffer != (char *)0x0) {
        (*Curl_cfree)(pcVar7->master_buffer);
        pcVar7->master_buffer = (char *)0x0;
      }
      if (pcVar7->localdev != (char *)0x0) {
        (*Curl_cfree)(pcVar7->localdev);
        pcVar7->localdev = (char *)0x0;
      }
      (*Curl_cfree)(pcVar7);
      goto LAB_0011d71d;
    }
LAB_0011d616:
    pcVar9 = Curl_llist_alloc(llist_dtor);
    pcVar7->send_pipe = pcVar9;
    pcVar9 = Curl_llist_alloc(llist_dtor);
    pcVar7->recv_pipe = pcVar9;
    pcVar9 = Curl_llist_alloc(llist_dtor);
    pcVar7->pend_pipe = pcVar9;
    pcVar9 = Curl_llist_alloc(llist_dtor);
    pcVar7->done_pipe = pcVar9;
    if (((pcVar7->send_pipe == (curl_llist *)0x0) || (pcVar7->recv_pipe == (curl_llist *)0x0)) ||
       (pcVar9 == (curl_llist *)0x0 || pcVar7->pend_pipe == (curl_llist *)0x0)) goto LAB_0011d686;
    pcVar8 = (data->set).str[5];
    if (pcVar8 != (char *)0x0) {
      pcVar8 = (*Curl_cstrdup)(pcVar8);
      pcVar7->localdev = pcVar8;
      if (pcVar8 == (char *)0x0) goto LAB_0011d686;
    }
    pcVar7->localportrange = (data->set).localportrange;
    pcVar7->localport = (data->set).localport;
    pcVar7->fclosesocket = (data->set).fclosesocket;
    pcVar7->closesocket_client = (data->set).closesocket_client;
  }
  if (pcVar7 == (connectdata *)0x0) {
LAB_0011d957:
    CVar17 = CURLE_OUT_OF_MEMORY;
    goto LAB_0011df9f;
  }
  *in_connect = pcVar7;
  sVar10 = strlen((data->change).url);
  sVar11 = 0x100;
  if (0x100 < sVar10) {
    sVar11 = sVar10;
  }
  pcVar8 = (data->state).pathbuffer;
  if (pcVar8 != (char *)0x0) {
    (*Curl_cfree)(pcVar8);
    (data->state).pathbuffer = (char *)0x0;
  }
  (data->state).path = (char *)0x0;
  pcVar8 = (char *)(*Curl_cmalloc)(sVar11 + 2);
  (data->state).pathbuffer = pcVar8;
  if (pcVar8 == (char *)0x0) {
LAB_0011df95:
    CVar17 = CURLE_OUT_OF_MEMORY;
    goto LAB_0011df9f;
  }
  (data->state).path = pcVar8;
  pcVar8 = (char *)(*Curl_cmalloc)(sVar11 + 2);
  (pcVar7->host).rawalloc = pcVar8;
  if (pcVar8 == (char *)0x0) {
    pcVar8 = (data->state).pathbuffer;
    if (pcVar8 != (char *)0x0) {
      (*Curl_cfree)(pcVar8);
      (data->state).pathbuffer = (char *)0x0;
    }
    (data->state).path = (char *)0x0;
    goto LAB_0011d957;
  }
  (pcVar7->host).name = pcVar8;
  *pcVar8 = '\0';
  pcVar16 = (data->state).path;
  pcVar8 = local_238;
  iVar6 = __isoc99_sscanf((data->change).url,"%15[^:]:%[^\n]",pcVar8,pcVar16);
  if ((iVar6 == 2) && (iVar6 = Curl_raw_equal(local_238,"file"), iVar6 != 0)) {
    if ((*pcVar16 == '/') && (pcVar16[1] == '/')) {
      sVar11 = strlen(pcVar16 + 2);
      memmove(pcVar16,pcVar16 + 2,sVar11 + 1);
    }
    if ((*pcVar16 != '/') && (pcVar8 = strchr(pcVar16,0x2f), pcVar8 != (char *)0x0)) {
      pcVar13 = pcVar8 + 1;
      if (pcVar8[1] != '/') {
        pcVar13 = pcVar8;
      }
      sVar11 = strlen(pcVar13);
      memmove(pcVar16,pcVar13,sVar11 + 1);
    }
    bVar20 = false;
    pcVar8 = "file";
LAB_0011da64:
    pcVar13 = (pcVar7->host).name;
    pcVar12 = strchr(pcVar13,0x40);
    pcVar14 = pcVar12 + 1;
    if (pcVar12 == (char *)0x0) {
      pcVar14 = pcVar13;
    }
    pcVar13 = strchr(pcVar14,0x3f);
    if (pcVar13 == (char *)0x0) {
      if (*pcVar16 == '\0') {
        pcVar16[0] = '/';
        pcVar16[1] = '\0';
      }
    }
    else {
      sVar11 = strlen(pcVar13);
      sVar10 = strlen(pcVar16);
      memmove(pcVar16 + sVar11 + 1,pcVar16,sVar10 + 1);
      memcpy(pcVar16 + 1,pcVar13,sVar11);
      *pcVar16 = '/';
      *pcVar13 = '\0';
    }
    if (*pcVar16 == '?') {
      sVar11 = strlen(pcVar16);
      memmove(pcVar16 + 1,pcVar16,sVar11 + 1);
      *pcVar16 = '/';
    }
    pcVar13 = (pcVar7->host).name;
    pcVar14 = strchr(pcVar13,0x40);
    local_338[0] = '\0';
    local_438[0] = '\0';
    bVar4 = true;
    CVar17 = CURLE_OK;
    if (pcVar14 != (char *)0x0) {
      (pcVar7->host).name = pcVar14 + 1;
      (pcVar7->bits).userpwd_in_url = true;
      CVar17 = CURLE_OK;
      if ((data->set).use_netrc != CURL_NETRC_REQUIRED) {
        (pcVar7->bits).user_passwd = true;
        if (*pcVar13 == ':') {
          __isoc99_sscanf(pcVar13,":%255[^@]",local_438);
        }
        else {
          __isoc99_sscanf(pcVar13,"%255[^:@]:%255[^@]",local_338);
        }
        if (local_338[0] != '\0') {
          pcVar13 = curl_easy_unescape(data,local_338,0,(int *)0x0);
          if (pcVar13 == (char *)0x0) {
            CVar17 = CURLE_OUT_OF_MEMORY;
            bVar4 = false;
            goto LAB_0011db52;
          }
          sVar11 = strlen(pcVar13);
          if (sVar11 < 0x100) {
            strcpy(local_338,pcVar13);
          }
          (*Curl_cfree)(pcVar13);
        }
        if (local_438[0] != '\0') {
          pcVar13 = curl_easy_unescape(data,local_438,0,(int *)0x0);
          if (pcVar13 == (char *)0x0) {
            bVar4 = false;
            CVar17 = CURLE_OUT_OF_MEMORY;
            goto LAB_0011db52;
          }
          sVar11 = strlen(pcVar13);
          if (sVar11 < 0x100) {
            strcpy(local_438,pcVar13);
          }
          (*Curl_cfree)(pcVar13);
        }
        bVar4 = true;
        CVar17 = CURLE_OK;
      }
    }
LAB_0011db52:
    if (bVar4) {
      pcVar13 = (pcVar7->host).name;
      if ((*pcVar13 == '[') && (pcVar13 = strstr(pcVar13,"%25"), pcVar13 != (char *)0x0)) {
        uVar15 = strtoul(pcVar13 + 3,local_138,10);
        if (*local_138[0] == ']') {
          local_440 = uVar15;
          sVar11 = strlen(local_138[0]);
          memmove(pcVar13,local_138[0],sVar11 + 1);
          if ((data->state).this_is_a_follow == false) {
            pcVar7->scope = (uint)local_440;
          }
        }
        else {
          Curl_infof(data,"Invalid IPv6 address format\n");
        }
      }
      uVar3 = (data->set).scope;
      if (uVar3 != 0) {
        pcVar7->scope = uVar3;
      }
      pcVar16 = strchr(pcVar16,0x23);
      if (pcVar16 != (char *)0x0) {
        *pcVar16 = '\0';
        pcVar16 = strchr((data->change).url,0x23);
        if (pcVar16 != (char *)0x0) {
          *pcVar16 = '\0';
        }
      }
      pCVar18 = &Curl_handler_http;
      ppCVar19 = protocols;
      do {
        ppCVar19 = ppCVar19 + 1;
        iVar6 = Curl_raw_equal(pCVar18->scheme,pcVar8);
        if (iVar6 != 0) {
          if ((((uint)(data->set).allowed_protocols & pCVar18->protocol) != 0) &&
             (((data->state).this_is_a_follow != true ||
              (((uint)(data->set).redir_protocols & pCVar18->protocol) != 0)))) {
            pcVar7->given = pCVar18;
            pcVar7->handler = pCVar18;
            CVar17 = CURLE_OK;
            goto LAB_0011ddbf;
          }
          break;
        }
        pCVar18 = *ppCVar19;
      } while (pCVar18 != (Curl_handler *)0x0);
      Curl_failf(data,"Protocol %s not supported or disabled in libcurl",pcVar8);
      CVar17 = CURLE_UNSUPPORTED_PROTOCOL;
    }
  }
  else {
    *pcVar16 = '\0';
    bVar20 = false;
    iVar6 = __isoc99_sscanf((data->change).url,"%15[^\n:]://%[^\n/?]%[^\n]",pcVar8,
                            (pcVar7->host).name);
    if (1 < iVar6) goto LAB_0011da64;
    iVar6 = __isoc99_sscanf((data->change).url,"%[^\n/?]%[^\n]",(pcVar7->host).name);
    if (0 < iVar6) {
      iVar6 = Curl_raw_nequal("FTP.",(pcVar7->host).name,4);
      bVar20 = true;
      if (iVar6 == 0) {
        iVar6 = Curl_raw_nequal("DICT.",(pcVar7->host).name,5);
        if (iVar6 == 0) {
          iVar6 = Curl_raw_nequal("LDAP.",(pcVar7->host).name,5);
          if (iVar6 == 0) {
            iVar6 = Curl_raw_nequal("IMAP.",(pcVar7->host).name,5);
            pcVar8 = "IMAP";
            if (iVar6 == 0) {
              pcVar8 = "http";
            }
          }
          else {
            pcVar8 = "LDAP";
          }
        }
        else {
          pcVar8 = "DICT";
        }
      }
      else {
        pcVar8 = "ftp";
      }
      goto LAB_0011da64;
    }
    bVar20 = false;
    Curl_failf(data,"<url> malformed");
    CVar17 = CURLE_URL_MALFORMAT;
  }
LAB_0011ddbf:
  if (CVar17 != CURLE_OK) goto LAB_0011df9f;
  if (bVar20) {
    pcVar8 = curl_maprintf("%s://%s",pcVar7->handler->scheme,(data->change).url);
    if (pcVar8 == (char *)0x0) goto LAB_0011d957;
    if ((data->change).url_alloc == true) {
      pcVar16 = (data->change).url;
      if (pcVar16 != (char *)0x0) {
        (*Curl_cfree)(pcVar16);
        (data->change).url = (char *)0x0;
      }
      (data->change).url_alloc = false;
    }
    (data->change).url = pcVar8;
    (data->change).url_alloc = true;
  }
  if (((pcVar7->given->flags & 0x40) != 0) &&
     (pcVar8 = strchr((pcVar7->data->state).path,0x3f), pcVar8 != (char *)0x0)) {
    *pcVar8 = '\0';
  }
  if ((pcVar7->bits).proxy_user_passwd == true) {
    memset(local_238,0,0x100);
    memset(local_138,0,0x100);
    pcVar8 = (data->set).str[0x1e];
    if (pcVar8 != (char *)0x0) {
      strncpy(local_238,pcVar8,0x100);
      local_139 = 0;
    }
    pcVar8 = (data->set).str[0x1f];
    if (pcVar8 != (char *)0x0) {
      strncpy((char *)local_138,pcVar8,0x100);
      local_39 = 0;
    }
    pcVar8 = curl_easy_unescape(data,local_238,0,(int *)0x0);
    pcVar7->proxyuser = pcVar8;
    if (pcVar8 == (char *)0x0) {
      CVar17 = CURLE_OUT_OF_MEMORY;
    }
    else {
      pcVar8 = curl_easy_unescape(data,(char *)local_138,0,(int *)0x0);
      pcVar7->proxypasswd = pcVar8;
      CVar17 = CURLE_OUT_OF_MEMORY;
      if (pcVar8 != (char *)0x0) {
        CVar17 = CURLE_OK;
      }
    }
    if (CVar17 != CURLE_OK) goto LAB_0011df9f;
  }
  pcVar8 = (data->set).str[0x10];
  if (pcVar8 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    pcVar8 = (*Curl_cstrdup)(pcVar8);
    if (pcVar8 == (char *)0x0) {
      Curl_failf(data,"memory shortage");
      goto LAB_0011df95;
    }
  }
  pcVar16 = (data->set).str[0x20];
  if ((pcVar16 == (char *)0x0) || (_Var21 = check_noproxy((pcVar7->host).name,pcVar16), !_Var21)) {
    if (pcVar8 == (char *)0x0) {
      pcVar8 = detect_proxy(pcVar7);
    }
  }
  else {
    if (pcVar8 != (char *)0x0) {
      (*Curl_cfree)(pcVar8);
    }
    pcVar8 = (char *)0x0;
  }
  if (pcVar8 == (char *)0x0) {
LAB_0011e077:
    pcVar8 = (char *)0x0;
  }
  else if ((*pcVar8 == '\0') || ((pcVar7->handler->flags & 0x10) != 0)) {
    (*Curl_cfree)(pcVar8);
    goto LAB_0011e077;
  }
  if (pcVar8 == (char *)0x0) {
    (pcVar7->bits).proxy = false;
    (pcVar7->bits).httpproxy = false;
    (pcVar7->bits).proxy_user_passwd = false;
    (pcVar7->bits).tunnel_proxy = false;
  }
  else {
    CVar17 = parse_proxy(data,pcVar7,pcVar8);
    (*Curl_cfree)(pcVar8);
    if (CVar17 != CURLE_OK) goto LAB_0011df9f;
    if (pcVar7->proxytype < 2) {
      _Var21 = true;
      if (((pcVar7->handler->protocol & 1) == 0) && ((pcVar7->bits).tunnel_proxy == false)) {
        pcVar7->handler = &Curl_handler_http;
      }
    }
    else {
      _Var21 = false;
    }
    (pcVar7->bits).httpproxy = _Var21;
    (pcVar7->bits).proxy = true;
  }
  CVar17 = setup_connection_internals(pcVar7);
  if (CVar17 == CURLE_OK) {
    pcVar7->recv[0] = Curl_recv_plain;
    pcVar7->send[0] = Curl_send_plain;
    pcVar7->recv[1] = Curl_recv_plain;
    pcVar7->send[1] = Curl_send_plain;
    if ((pcVar7->handler->flags & 0x10) == 0) {
      if (((pcVar7->given->flags & 1) != 0) && ((pcVar7->bits).httpproxy == true)) {
        (pcVar7->bits).tunnel_proxy = true;
      }
      CVar17 = parse_remote_port(data,pcVar7);
      if (CVar17 == CURLE_OK) {
        override_userpass(data,pcVar7,local_338,local_438);
        CVar17 = set_userpass(pcVar7,local_338,local_438);
        if (CVar17 == CURLE_OK) {
          pcVar8 = (data->set).str[0x15];
          (data->set).ssl.CApath = (data->set).str[0x14];
          (data->set).ssl.CAfile = pcVar8;
          pcVar8 = (data->set).str[0x1b];
          (data->set).ssl.CRLfile = (data->set).str[0x1a];
          (data->set).ssl.issuercert = pcVar8;
          (data->set).ssl.random_file = (data->set).str[0x18];
          (data->set).ssl.egdsocket = (data->set).str[0x17];
          (data->set).ssl.cipher_list = (data->set).str[0x16];
          _Var21 = Curl_clone_ssl_config(&(data->set).ssl,&pcVar7->ssl_config);
          CVar17 = CURLE_OUT_OF_MEMORY;
          if (_Var21) {
            if ((((data->set).reuse_fresh == true) && ((data->state).this_is_a_follow != true)) ||
               (_Var21 = ConnectionExists(data,pcVar7,&local_448), pcVar5 = local_448, !_Var21)) {
              ConnectionStore(data,pcVar7);
            }
            else {
              reuse_conn(pcVar7,local_448);
              (*Curl_cfree)(pcVar7);
              *in_connect = pcVar5;
              pcVar8 = (pcVar5->host).name;
              (pcVar5->host).dispname = pcVar8;
              do {
                cVar1 = *pcVar8;
                pcVar8 = pcVar8 + 1;
              } while ('\0' < cVar1);
              if (cVar1 != '\0') {
                Curl_infof(data,"IDN support not present, can\'t parse Unicode domains\n");
              }
              Curl_infof(data,"Re-using existing connection! (#%ld) with host %s\n",
                         pcVar5->connectindex,
                         *(undefined8 *)
                          (pcVar5->primary_ip +
                          (ulong)((pcVar5->proxy).name != (char *)0x0) * 0x20 + -0x32));
              pcVar7 = pcVar5;
            }
            do_init(pcVar7);
            CVar17 = setup_range(data);
            if (CVar17 == CURLE_OK) {
              pcVar7->fread_func = (data->set).fread_func;
              pcVar7->fread_in = (data->set).in;
              pcVar7->seek_func = (data->set).seek_func;
              pcVar7->seek_client = (data->set).seek_client;
              CVar17 = resolve_server(data,pcVar7,asyncp);
            }
          }
        }
      }
    }
    else {
      CVar17 = (*pcVar7->handler->connect_it)(pcVar7,local_238);
      if (CVar17 == CURLE_OK) {
        pcVar7->data = data;
        (pcVar7->bits).tcpconnect[0] = true;
        ConnectionStore(data,pcVar7);
        CVar17 = setup_range(data);
        if (CVar17 == CURLE_OK) {
          CVar17 = CURLE_OK;
          Curl_setup_transfer(pcVar7,-1,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
        }
        else {
          (*pcVar7->handler->done)(pcVar7,CVar17,false);
        }
      }
    }
  }
  else if (pcVar8 != (char *)0x0) {
    (*Curl_cfree)(pcVar8);
  }
LAB_0011df9f:
  if (CVar17 == CURLE_OK) {
    pcVar7 = *in_connect;
    if ((pcVar7->send_pipe->size == 0) && (pcVar7->recv_pipe->size == 0)) {
      CVar17 = CURLE_OK;
      if (*asyncp == false) {
        CVar17 = Curl_setup_conn(pcVar7,protocol_done);
      }
    }
    else {
      *protocol_done = true;
      CVar17 = CURLE_OK;
    }
  }
  if ((CVar17 != CURLE_OK) && (*in_connect != (connectdata *)0x0)) {
    Curl_disconnect(*in_connect,false);
    *in_connect = (connectdata *)0x0;
  }
  return CVar17;
}

Assistant:

CURLcode Curl_connect(struct SessionHandle *data,
                      struct connectdata **in_connect,
                      bool *asyncp,
                      bool *protocol_done)
{
  CURLcode code;

  *asyncp = FALSE; /* assume synchronous resolves by default */

  /* call the stuff that needs to be called */
  code = create_conn(data, in_connect, asyncp);

  if(CURLE_OK == code) {
    /* no error */
    if((*in_connect)->send_pipe->size || (*in_connect)->recv_pipe->size)
      /* pipelining */
      *protocol_done = TRUE;
    else if(!*asyncp) {
      /* DNS resolution is done: that's either because this is a reused
         connection, in which case DNS was unnecessary, or because DNS
         really did finish already (synch resolver/fast async resolve) */
      code = Curl_setup_conn(*in_connect, protocol_done);
    }
  }

  if(code && *in_connect) {
    /* We're not allowed to return failure with memory left allocated
       in the connectdata struct, free those here */
    Curl_disconnect(*in_connect, FALSE); /* close the connection */
    *in_connect = NULL;           /* return a NULL */
  }

  return code;
}